

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMInfo.cpp
# Opt level: O2

ROMImage * MT32Emu::ROMImage::interleaveImages(ROMImage *romImageEven,ROMImage *romImageOdd)

{
  ulong dataSize;
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Bit8u *data;
  ROMImage *romImage;
  size_t romDataIx;
  long lVar4;
  
  iVar1 = (*romImageEven->file->_vptr_File[3])();
  iVar2 = (*romImageOdd->file->_vptr_File[3])();
  iVar3 = (*romImageEven->file->_vptr_File[2])();
  dataSize = CONCAT44(extraout_var_01,iVar3) * 2;
  data = (Bit8u *)operator_new__(dataSize);
  for (lVar4 = 0; CONCAT44(extraout_var_01,iVar3) != lVar4; lVar4 = lVar4 + 1) {
    data[lVar4 * 2] = *(Bit8u *)(CONCAT44(extraout_var,iVar1) + lVar4);
    data[lVar4 * 2 + 1] = *(Bit8u *)(CONCAT44(extraout_var_00,iVar2) + lVar4);
  }
  romImage = makeFullROMImage(data,dataSize);
  if (romImage->romInfo == (ROMInfo *)0x0) {
    freeROMImage(romImage);
    romImage = (ROMImage *)0x0;
  }
  return romImage;
}

Assistant:

const ROMImage *ROMImage::interleaveImages(const ROMImage *romImageEven, const ROMImage *romImageOdd) {
	const Bit8u *romDataEven = romImageEven->getFile()->getData();
	const Bit8u *romDataOdd = romImageOdd->getFile()->getData();
	size_t partSize = romImageEven->getFile()->getSize();
	Bit8u *data = new Bit8u[2 * partSize];
	Bit8u *writePtr = data;
	for (size_t romDataIx = 0; romDataIx < partSize; romDataIx++) {
		*(writePtr++) = romDataEven[romDataIx];
		*(writePtr++) = romDataOdd[romDataIx];
	}
	const ROMImage *romImageFull = makeFullROMImage(data, 2 * partSize);
	if (romImageFull->getROMInfo() == NULL) {
		freeROMImage(romImageFull);
		return NULL;
	}
	return romImageFull;
}